

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigVec.c
# Opt level: O1

int Fraig_NodeVecCompareLevelsIncreasing(Fraig_Node_t **pp1,Fraig_Node_t **pp2)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  
  iVar2 = *(int *)(((ulong)*pp1 & 0xfffffffffffffffe) + 8);
  iVar1 = *(int *)(((ulong)*pp2 & 0xfffffffffffffffe) + 8);
  uVar3 = 0xffffffff;
  if (iVar1 <= iVar2) {
    uVar3 = (uint)(iVar1 < iVar2);
  }
  return uVar3;
}

Assistant:

int Fraig_NodeVecCompareLevelsIncreasing( Fraig_Node_t ** pp1, Fraig_Node_t ** pp2 )
{
    int Level1 = Fraig_Regular(*pp1)->Level;
    int Level2 = Fraig_Regular(*pp2)->Level;
    if ( Level1 < Level2 )
        return -1;
    if ( Level1 > Level2 )
        return 1;
    return 0; 
}